

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void argo::operator<<(string *s,json *j)

{
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  json *local_18;
  json *j_local;
  string *s_local;
  
  local_18 = j;
  j_local = (json *)s;
  std::__cxx11::stringstream::stringstream(local_1a0);
  unparser::unparse(local_190,local_18," ",""," ",0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)j_local,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void NAMESPACE::operator<<(string &s, const json &j)
{
    stringstream ss;
    unparser::unparse(ss, j);
    s = ss.str();
}